

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TeamCityReporter::testCaseStarting(TeamCityReporter *this,TestCaseInfo *testInfo)

{
  ostream *poVar1;
  size_type in_RCX;
  StringRef str;
  StringRef local_48;
  string local_38;
  TestCaseInfo *local_18;
  TestCaseInfo *testInfo_local;
  TeamCityReporter *this_local;
  
  local_18 = testInfo;
  testInfo_local = (TestCaseInfo *)this;
  Timer::start(&this->m_testTimer);
  StreamingReporterBase::testCaseStarting(&this->super_StreamingReporterBase,local_18);
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           "##teamcity[testStarted name=\'");
  StringRef::StringRef(&local_48,&local_18->name);
  str.m_size = in_RCX;
  str.m_start = (char *)local_48.m_size;
  (anonymous_namespace)::escape_abi_cxx11_(&local_38,(_anonymous_namespace_ *)local_48.m_start,str);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::ostream::flush();
  return;
}

Assistant:

void TeamCityReporter::testCaseStarting(TestCaseInfo const& testInfo) {
        m_testTimer.start();
        StreamingReporterBase::testCaseStarting(testInfo);
        m_stream << "##teamcity[testStarted name='"
            << escape(testInfo.name) << "']\n";
        m_stream.flush();
    }